

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

Dim * __thiscall
dynet::DotProduct::dim_forward
          (Dim *__return_storage_ptr__,DotProduct *this,
          vector<dynet::Dim,_std::allocator<dynet::Dim>_> *xs)

{
  Dim *d;
  pointer pDVar1;
  uint b;
  bool bVar2;
  ostream *poVar3;
  invalid_argument *this_00;
  initializer_list<unsigned_int> x;
  uint local_14;
  
  d = (xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
      super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)d == 0x48) {
    bVar2 = LooksLikeVector(d);
    if (bVar2) {
      bVar2 = LooksLikeVector((xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>).
                              _M_impl.super__Vector_impl_data._M_start + 1);
      if ((bVar2) &&
         (pDVar1 = (xs->super__Vector_base<dynet::Dim,_std::allocator<dynet::Dim>_>)._M_impl.
                   super__Vector_impl_data._M_start, pDVar1->d[0] == pDVar1[1].d[0])) {
        b = pDVar1[1].bd;
        if (pDVar1[1].bd < pDVar1->bd) {
          b = pDVar1->bd;
        }
        x._M_len = 1;
        x._M_array = &local_14;
        Dim::Dim(__return_storage_ptr__,x,b);
        return __return_storage_ptr__;
      }
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,"Bad arguments to DotProduct: ");
  poVar3 = operator<<(poVar3,xs);
  std::endl<char,std::char_traits<char>>(poVar3);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Bad arguments to DotProduct");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim DotProduct::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 ||
      !LooksLikeVector(xs[0]) ||
      !LooksLikeVector(xs[1]) ||
      xs[0].rows() != xs[1].rows()) {
    cerr << "Bad arguments to DotProduct: " << xs << endl;
    throw std::invalid_argument("Bad arguments to DotProduct");
  }
  return Dim({1}, max(xs[0].bd, xs[1].bd));
}